

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::UniformInfiniteLight::Le(UniformInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  Float a;
  undefined1 auVar1 [16];
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar4;
  SampledSpectrum local_10;
  
  a = this->scale;
  auVar3 = (undefined1  [56])0x0;
  SVar4 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar2._0_8_ = SVar4.values.values._0_8_;
  auVar2._8_56_ = auVar3;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = SVar4.values.values._8_8_;
  local_10.values.values = (array<float,_4>)vmovlhps_avx(auVar2._0_16_,auVar1);
  SVar4 = SampledSpectrum::operator*(&local_10,a);
  return (array<float,_4>)(array<float,_4>)SVar4;
}

Assistant:

SampledSpectrum UniformInfiniteLight::Le(const Ray &ray,
                                         const SampledWavelengths &lambda) const {
    return scale * Lemit.Sample(lambda);
}